

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O3

void __thiscall
duckdb::TableStatistics::InitializeEmpty
          (TableStatistics *this,vector<duckdb::LogicalType,_true> *types)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var1;
  pointer pLVar2;
  _Head_base<0UL,_duckdb::ReservoirChunk_*,_false> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> this_02;
  mutex *__tmp;
  pointer type;
  _Head_base<0UL,_duckdb::ReservoirChunk_*,_false> local_30;
  element_type *local_28;
  
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_024486c0;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  (this->stats_lock).internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_01 + 1);
  this_00 = (this->stats_lock).internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->stats_lock).internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = this_01;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this_02._M_head_impl = (BlockingSample *)operator_new(0x58);
  local_30._M_head_impl = (ReservoirChunk *)0x0;
  ReservoirSample::ReservoirSample
            ((ReservoirSample *)this_02._M_head_impl,0x800,
             (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              *)&stack0xffffffffffffffd0);
  _Var3._M_head_impl = local_30._M_head_impl;
  if (&(local_30._M_head_impl)->chunk != (DataChunk *)0x0) {
    DataChunk::~DataChunk(&(local_30._M_head_impl)->chunk);
    operator_delete(_Var3._M_head_impl);
  }
  _Var1._M_head_impl =
       (this->table_sample).
       super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
       .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
  (this->table_sample).
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = this_02._M_head_impl;
  if (_Var1._M_head_impl != (BlockingSample *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockingSample + 8))();
  }
  type = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
  pLVar2 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (type != pLVar2) {
    do {
      ColumnStatistics::CreateEmptyStats((ColumnStatistics *)&stack0xffffffffffffffd0,type);
      ::std::
      vector<duckdb::shared_ptr<duckdb::ColumnStatistics,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
                ((vector<duckdb::shared_ptr<duckdb::ColumnStatistics,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>>
                  *)&this->column_stats,
                 (shared_ptr<duckdb::ColumnStatistics,_true> *)&stack0xffffffffffffffd0);
      if (local_28 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
      }
      type = type + 1;
    } while (type != pLVar2);
  }
  return;
}

Assistant:

void TableStatistics::InitializeEmpty(const vector<LogicalType> &types) {
	D_ASSERT(Empty());
	D_ASSERT(!table_sample);

	stats_lock = make_shared_ptr<mutex>();
	table_sample = make_uniq<ReservoirSample>(static_cast<idx_t>(FIXED_SAMPLE_SIZE));
	for (auto &type : types) {
		column_stats.push_back(ColumnStatistics::CreateEmptyStats(type));
	}
}